

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearScan.cpp
# Opt level: O1

void __thiscall
LinearScan::InsertSecondChanceCompensation
          (LinearScan *this,Lifetime **branchRegContent,Lifetime **labelRegContent,
          BranchInstr *branchInstr,LabelInstr *labelInstr)

{
  byte *pbVar1;
  char cVar2;
  OpCode OVar3;
  uint uVar4;
  Func *lifetime;
  Func *lifetime_00;
  Loop *loop;
  Lifetime *pLVar5;
  Lifetime *lifetime_01;
  code *pcVar6;
  Lifetime *pLVar7;
  BitVector BVar8;
  bool bVar9;
  BOOLEAN BVar10;
  uint32 uVar11;
  Instr *instr;
  undefined4 *puVar12;
  LabelInstr *pLVar13;
  char *message;
  char *error;
  long lVar14;
  ulong uVar15;
  uint lineNumber;
  RegNum reg_00;
  ulong uVar16;
  RegNum reg;
  Lifetime *local_198;
  Lifetime *tmpRegContent [33];
  Instr *local_80;
  BitVector local_78;
  BitVector thrashedRegs;
  LabelInstr *local_50;
  Instr *local_48;
  bool local_33;
  bool local_32;
  byte local_31;
  
  instr = IR::Instr::GetPrevRealInstrOrLabel(&branchInstr->super_Instr);
  OVar3 = (branchInstr->super_Instr).m_opcode;
  if (OVar3 < ADD) {
    bVar9 = OVar3 == MultiBr || OVar3 == Br;
  }
  else {
    bVar9 = LowererMD::IsUnconditionalBranch(&branchInstr->super_Instr);
  }
  local_32 = true;
  if (bVar9 != false) {
    if (instr->m_kind == InstrKindBranch) {
      OVar3 = instr->m_opcode;
      if (OVar3 < ADD) {
        bVar9 = OVar3 == MultiBr || OVar3 == Br;
      }
      else {
        bVar9 = LowererMD::IsUnconditionalBranch(instr);
      }
      if (bVar9 == false) goto LAB_0058fb58;
    }
    local_32 = branchInstr->m_branchTarget == (LabelInstr *)0x0;
    if (local_32) {
      if (branchInstr->m_isMultiBranch == false) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
        *puVar12 = 1;
        error = "(m_isMultiBranch)";
        message = "m_isMultiBranch";
        lineNumber = 0x20e;
        goto LAB_0058fb44;
      }
    }
    else if (branchInstr->m_isMultiBranch != false) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      error = "(!m_isMultiBranch)";
      message = "!m_isMultiBranch";
      lineNumber = 0x209;
LAB_0058fb44:
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,lineNumber,error,message);
      if (!bVar9) goto LAB_00590423;
      *puVar12 = 0;
    }
  }
LAB_0058fb58:
  local_33 = false;
  local_80 = (branchInstr->super_Instr).m_prev;
  local_78.word = 0;
  thrashedRegs.word = (Type)branchInstr;
  if (this->regContent == branchRegContent) {
    if ((labelInstr->field_0x78 & 1) == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x2e2,"(this->m_isLoopTop)","this->m_isLoopTop");
      if (!bVar9) goto LAB_00590423;
      *puVar12 = 0;
    }
    loop = labelInstr->m_loop;
    js_memcpy_s(&local_198,0x108,this->regContent,0x108);
    AvoidCompensationConflicts
              (this,labelInstr,branchInstr,labelRegContent,&local_198,(Instr **)&thrashedRegs,
               &local_80,local_32,&local_33);
    uVar15 = (this->secondChanceRegs).word;
    local_50 = (LabelInstr *)thrashedRegs.word;
    local_31 = local_33;
    local_48 = local_80;
    if (uVar15 != 0) {
      uVar16 = 0;
      if (uVar15 != 0) {
        for (; (uVar15 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
        }
      }
      tmpRegContent[0x20] = (Lifetime *)__tls_get_addr(&PTR_0155fe48);
      do {
        BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar16);
        pLVar5 = labelRegContent[uVar16 & 0xffffffff];
        lifetime_01 = tmpRegContent[(uVar16 & 0xffffffff) - 1];
        if (((lifetime_01 != (Lifetime *)0x0) &&
            (uVar4 = lifetime_01->start, uVar11 = IR::Instr::GetNumber(&labelInstr->super_Instr),
            uVar4 < uVar11)) &&
           (uVar4 = lifetime_01->lastAllocationStart,
           uVar11 = IR::Instr::GetNumber(&labelInstr->super_Instr), pLVar7 = tmpRegContent[0x20],
           uVar11 < uVar4)) {
          if ((labelInstr->field_0x78 & 1) == 0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)&pLVar7->sym = 1;
            bVar9 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                               ,0x2e2,"(this->m_isLoopTop)","this->m_isLoopTop");
            if (!bVar9) {
              thrashedRegs.word = (Type)local_50;
              local_33 = (bool)local_31;
              local_80 = local_48;
              goto LAB_00590423;
            }
            *(undefined4 *)&pLVar7->sym = 0;
          }
          BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                             ((labelInstr->m_loop->regAlloc).liveOnBackEdgeSyms,
                              (lifetime_01->sym->super_Sym).m_id);
          if ((BVar10 != '\0') &&
             ((SList<IR::Instr_*,_Memory::ArenaAllocator,_RealCount> *)
              (lifetime_01->defList).super_SListBase<IR::Instr_*,_Memory::ArenaAllocator,_RealCount>
              .super_SListNodeBase<Memory::ArenaAllocator>.next != &lifetime_01->defList)) {
            if ((local_32 != false) && ((local_31 & 1) == 0)) {
              InsertAirlock(this,branchInstr,labelInstr);
              local_48 = (labelInstr->super_Instr).m_prev;
              local_31 = 1;
              local_50 = labelInstr;
            }
            InsertStores(this,lifetime_01,lifetime_01->reg,local_48);
          }
        }
        if (lifetime_01 != pLVar5) {
          bVar9 = NeedsLoopBackEdgeCompensation(this,lifetime_01,labelInstr);
          reg_00 = (RegNum)uVar16;
          if (bVar9) {
            if ((local_32 != false) && ((local_31 & 1) == 0)) {
              InsertAirlock(this,branchInstr,labelInstr);
              local_48 = (labelInstr->super_Instr).m_prev;
              local_31 = 1;
              local_50 = labelInstr;
            }
            ReconcileRegContent(this,&local_198,labelRegContent,branchInstr,labelInstr,lifetime_01,
                                reg_00,&local_78,&local_50->super_Instr,local_48);
          }
          if (((((pLVar5 != (Lifetime *)0x0) && ((pLVar5->field_0x9c & 1) != 0)) &&
               (bVar9 = StackSym::IsConst(pLVar5->sym), !bVar9)) &&
              ((uVar4 = pLVar5->end, uVar11 = IR::Instr::GetNumber(&branchInstr->super_Instr),
               uVar11 <= uVar4 &&
               (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                                   ((loop->regAlloc).liveOnBackEdgeSyms,
                                    (pLVar5->sym->super_Sym).m_id), BVar10 != '\0')))) &&
             (bVar9 = ClearLoopExitIfRegUnused(this,pLVar5,reg_00,branchInstr,loop), !bVar9)) {
            if ((local_32 != false) && ((local_31 & 1) == 0)) {
              InsertAirlock(this,branchInstr,labelInstr);
              local_48 = (labelInstr->super_Instr).m_prev;
              local_31 = 1;
              local_50 = labelInstr;
            }
            ReconcileRegContent(this,&local_198,labelRegContent,branchInstr,labelInstr,pLVar5,reg_00
                                ,&local_78,&local_50->super_Instr,local_48);
          }
        }
        uVar15 = uVar15 & ~(1L << (uVar16 & 0x3f));
        lVar14 = 0;
        if (uVar15 != 0) {
          for (; (uVar15 >> lVar14 & 1) == 0; lVar14 = lVar14 + 1) {
          }
        }
        uVar16 = (ulong)(-(uint)(uVar15 == 0) | (uint)lVar14);
      } while (uVar15 != 0);
    }
    thrashedRegs.word = (Type)local_50;
    local_33 = (bool)local_31;
    local_80 = local_48;
    uVar15 = 1;
    do {
      pLVar5 = labelRegContent[uVar15];
      if ((((pLVar5 != (Lifetime *)0x0) && (bVar9 = StackSym::IsConst(pLVar5->sym), !bVar9)) &&
          (pLVar5 != tmpRegContent[uVar15 - 1])) &&
         ((BVUnitT<unsigned_long>::AssertRange((BVIndex)uVar15),
          (local_78.word >> (uVar15 & 0x3f) & 1) == 0 &&
          (BVar10 = BVSparse<Memory::JitArenaAllocator>::Test
                              ((loop->regAlloc).liveOnBackEdgeSyms,(pLVar5->sym->super_Sym).m_id),
          BVar10 != '\0')))) {
        bVar9 = ClearLoopExitIfRegUnused(this,pLVar5,(RegNum)uVar15,branchInstr,loop);
        if (!bVar9) {
          if ((local_32 != false) && ((local_31 & 1) == 0)) {
            InsertAirlock(this,branchInstr,labelInstr);
            local_48 = (labelInstr->super_Instr).m_prev;
            local_31 = 1;
            local_50 = labelInstr;
          }
          ReconcileRegContent(this,&local_198,labelRegContent,branchInstr,labelInstr,pLVar5,
                              (RegNum)uVar15,&local_78,&local_50->super_Instr,local_48);
        }
      }
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x21);
    thrashedRegs.word = (Type)local_50;
    local_80 = local_48;
    if ((local_31 & 1) != 0) {
      (loop->regAlloc).hasAirLock = true;
    }
  }
  else {
    local_31 = 0;
    lVar14 = 0x76;
    local_50 = (LabelInstr *)branchInstr;
    local_48 = local_80;
    do {
      lifetime = (Func *)branchRegContent[lVar14 + -0x75];
      lifetime_00 = (&this->func)[lVar14];
      if ((lifetime_00 != lifetime) &&
         (((lifetime_00 == (Func *)0x0 || lifetime != (Func *)0x0 ||
           (uVar4 = *(uint *)&lifetime_00->propertiesWrittenTo,
           uVar11 = IR::Instr::GetNumber(&branchInstr->super_Instr), uVar4 <= uVar11)) ||
          ((labelInstr->super_Instr).m_opcode != GeneratorBailInLabel)))) {
        if ((((lifetime != (Func *)0x0) &&
             (((lifetime->lazyBailoutProperties).
               super_BaseDictionary<int,_int,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
               .bucketCount & 1) != 0)) &&
            (bVar9 = StackSym::IsConst((StackSym *)lifetime->m_alloc), !bVar9)) &&
           (uVar4 = *(uint32 *)((long)&lifetime->propertiesWrittenTo + 4),
           uVar11 = IR::Instr::GetNumber(&labelInstr->super_Instr), uVar11 < uVar4)) {
          if ((local_32 != false) && ((local_31 & 1) == 0)) {
            InsertAirlock(this,branchInstr,labelInstr);
            local_48 = (labelInstr->super_Instr).m_prev;
            local_31 = 1;
            local_50 = labelInstr;
          }
          ReconcileRegContent(this,branchRegContent,labelRegContent,branchInstr,labelInstr,
                              (Lifetime *)lifetime,(char)lVar14 + 0x8b,&local_78,
                              &local_50->super_Instr,local_48);
        }
        if (((lifetime_00 != (Func *)0x0) &&
            (bVar9 = StackSym::IsConst((StackSym *)lifetime_00->m_alloc), !bVar9)) &&
           (uVar4 = *(uint *)&lifetime_00->propertiesWrittenTo,
           uVar11 = IR::Instr::GetNumber(&branchInstr->super_Instr), uVar4 <= uVar11)) {
          if ((local_32 != false) && ((local_31 & 1) == 0)) {
            InsertAirlock(this,branchInstr,labelInstr);
            local_48 = (labelInstr->super_Instr).m_prev;
            local_31 = 1;
            local_50 = labelInstr;
          }
          ReconcileRegContent(this,branchRegContent,labelRegContent,branchInstr,labelInstr,
                              (Lifetime *)lifetime_00,(char)lVar14 + 0x8b,&local_78,
                              &local_50->super_Instr,local_48);
        }
      }
      lVar14 = lVar14 + 1;
    } while (lVar14 != 0x96);
    thrashedRegs.word = (Type)local_50;
    local_80 = local_48;
  }
  BVar8.word = thrashedRegs.word;
  if (local_31 == 1) {
    lVar14 = *(long *)(thrashedRegs.word + 0x18);
    cVar2 = *(char *)(lVar14 + 0x39);
    if ((cVar2 != '\x05') && (cVar2 != '\x03')) {
      return;
    }
    if ((*(char *)(thrashedRegs.word + 0x39) != '\x05') &&
       (*(char *)(thrashedRegs.word + 0x39) != '\x03')) {
      return;
    }
    local_33 = (bool)local_31;
    if ((cVar2 != '\x03') && (cVar2 != '\x05')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar9) goto LAB_00590423;
      *puVar12 = 0;
    }
    if ((*(byte *)(lVar14 + 0x78) & 2) == 0) {
      return;
    }
    if ((*(char *)(BVar8.word + 0x39) != '\x03') && (*(char *)(BVar8.word + 0x39) != '\x05')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar9) goto LAB_00590423;
      *puVar12 = 0;
    }
    if ((*(byte *)(BVar8.word + 0x78) & 2) != 0) {
      return;
    }
    lVar14 = *(long *)(BVar8.word + 0x18);
    cVar2 = *(char *)(lVar14 + 0x39);
    if ((cVar2 != '\x03') && (cVar2 != '\x05')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar9) goto LAB_00590423;
      *puVar12 = 0;
    }
    if ((*(byte *)(lVar14 + 0x78) & 2) != 0) {
      pLVar13 = IR::Instr::AsLabelInstr(*(Instr **)(BVar8.word + 0x18));
      pLVar13->field_0x78 = pLVar13->field_0x78 | 0x20;
    }
    lVar14 = *(long *)(BVar8.word + 0x18);
    cVar2 = *(char *)(lVar14 + 0x39);
    if ((cVar2 != '\x03') && (cVar2 != '\x05')) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar12 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar12 = 1;
      bVar9 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar9) {
LAB_00590423:
        pcVar6 = (code *)invalidInstructionException();
        (*pcVar6)();
      }
      *puVar12 = 0;
    }
    pbVar1 = (byte *)(lVar14 + 0x78);
    *pbVar1 = *pbVar1 & 0xfd;
  }
  return;
}

Assistant:

void
LinearScan::InsertSecondChanceCompensation(Lifetime ** branchRegContent, Lifetime **labelRegContent,
                                           IR::BranchInstr *branchInstr, IR::LabelInstr *labelInstr)
{
    IR::Instr *prevInstr = branchInstr->GetPrevRealInstrOrLabel();
    bool needsAirlock = branchInstr->IsConditional() || (prevInstr->IsBranchInstr() && prevInstr->AsBranchInstr()->IsConditional()) || branchInstr->IsMultiBranch();
    bool hasAirlock = false;
    IR::Instr *insertionInstr = branchInstr;
    IR::Instr *insertionStartInstr = branchInstr->m_prev;
    // For loop back-edge, we want to keep the insertionStartInstr before the branch as spill need to happen on all paths
    // Pass a dummy instr address to airLockBlock insertion code.
    BitVector thrashedRegs(0);
    bool isLoopBackEdge = (this->regContent == branchRegContent);
    Lifetime * tmpRegContent[RegNumCount];
    Lifetime **regContent = this->regContent;

    if (isLoopBackEdge)
    {
        Loop *loop = labelInstr->GetLoop();

        js_memcpy_s(&tmpRegContent, (RegNumCount * sizeof(Lifetime *)), this->regContent, sizeof(this->regContent));

        branchRegContent = tmpRegContent;
        regContent = tmpRegContent;

#if defined(_M_IX86) || defined(_M_X64)
        // Insert XCHG to avoid some conflicts for int regs
        // Note: no XCHG on ARM or SSE2.  We could however use 3 XOR on ARM...
        this->AvoidCompensationConflicts(labelInstr, branchInstr, labelRegContent, branchRegContent,
                                         &insertionInstr, &insertionStartInstr, needsAirlock, &hasAirlock);
#endif


        FOREACH_BITSET_IN_UNITBV(reg, this->secondChanceRegs, BitVector)
        {
            Lifetime *labelLifetime = labelRegContent[reg];
            Lifetime *lifetime = branchRegContent[reg];

            // 1.  Insert Stores
            //          Lifetime starts before the loop
            //          Lifetime was re-allocated within the loop (i.e.: a load was most likely inserted)
            //          Lifetime is live on back-edge and has unsaved defs.

            if (lifetime && lifetime->start < labelInstr->GetNumber() && lifetime->lastAllocationStart > labelInstr->GetNumber()
                && (labelInstr->GetLoop()->regAlloc.liveOnBackEdgeSyms->Test(lifetime->sym->m_id))
                && !lifetime->defList.Empty())
            {
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                // If the lifetime was second chance allocated inside the loop, there might
                // be spilled loads of this symbol in the loop.  Insert the stores.
                // We don't need to do this if the lifetime was re-allocated before the loop.
                //
                // Note that reg may not be equal to lifetime->reg because of inserted XCHG...
                this->InsertStores(lifetime, lifetime->reg, insertionStartInstr);
            }

            if (lifetime == labelLifetime)
            {
                continue;
            }

            // 2.   MOV labelReg/MEM, branchReg
            //          Move current register to match content at the top of the loop
            if (this->NeedsLoopBackEdgeCompensation(lifetime, labelInstr))
            {
                // Mismatch, we need to insert compensation code
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                // MOV ESI, EAX
                // MOV EDI, ECX
                // MOV ECX, ESI
                // MOV EAX, EDI <<<
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          lifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }

            // 2.   MOV labelReg, MEM
            //          Lifetime was in a reg at the top of the loop but is spilled right now.
            if (labelLifetime && labelLifetime->isSpilled && !labelLifetime->sym->IsConst() && labelLifetime->end >= branchInstr->GetNumber())
            {
                if (!loop->regAlloc.liveOnBackEdgeSyms->Test(labelLifetime->sym->m_id))
                {
                    continue;
                }
                if (this->ClearLoopExitIfRegUnused(labelLifetime, (RegNum)reg, branchInstr, loop))
                {
                    continue;
                }
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          labelLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_BITSET_IN_UNITBV;

        // 3.   MOV labelReg, MEM
        //          Finish up reloading lifetimes needed at the top.  #2 only handled secondChanceRegs.

        FOREACH_REG(reg)
        {
            // Handle lifetimes in a register at the top of the loop, but not currently.
            Lifetime *labelLifetime = labelRegContent[reg];
            if (labelLifetime && !labelLifetime->sym->IsConst() && labelLifetime != branchRegContent[reg] && !thrashedRegs.Test(reg)
                && (loop->regAlloc.liveOnBackEdgeSyms->Test(labelLifetime->sym->m_id)))
            {
                if (this->ClearLoopExitIfRegUnused(labelLifetime, (RegNum)reg, branchInstr, loop))
                {
                    continue;
                }
                // Mismatch, we need to insert compensation code
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);

                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                            labelLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_REG;

        if (hasAirlock)
        {
            loop->regAlloc.hasAirLock = true;
        }
    }
    else
    {
        //
        // Non-loop-back-edge merge
        //
        FOREACH_REG(reg)
        {
            Lifetime *branchLifetime = branchRegContent[reg];
            Lifetime *lifetime = regContent[reg];

            if (lifetime == branchLifetime)
            {
                continue;
            }

            // Allow us to properly insert compensation code for symbols whose lifetimes start after the generator jump table
            // The GeneratorBailInLabel will have 2 edges in: one from the normal flow, one straight from the generator jump table
            if (!branchLifetime && lifetime && lifetime->start > branchInstr->GetNumber() && labelInstr->m_opcode == Js::OpCode::GeneratorBailInLabel)
            {
                continue;
            }

            if (branchLifetime && branchLifetime->isSpilled && !branchLifetime->sym->IsConst() && branchLifetime->end > labelInstr->GetNumber())
            {
                // The lifetime was in a reg at the branch and is now spilled.  We need a store on this path.
                //
                //  MOV  MEM, branch_REG
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          branchLifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
            if (lifetime && !lifetime->sym->IsConst() && lifetime->start <= branchInstr->GetNumber())
            {
                // MOV  label_REG, branch_REG / MEM
                insertionInstr = this->EnsureAirlock(needsAirlock, &hasAirlock, insertionInstr, &insertionStartInstr, branchInstr, labelInstr);
                this->ReconcileRegContent(branchRegContent, labelRegContent, branchInstr, labelInstr,
                                          lifetime, (RegNum)reg, &thrashedRegs, insertionInstr, insertionStartInstr);
            }
        } NEXT_REG;
    }

    if (hasAirlock)
    {
        // Fix opHelper on airlock label.
        if (insertionInstr->m_prev->IsLabelInstr() && insertionInstr->IsLabelInstr())
        {
            if (insertionInstr->m_prev->AsLabelInstr()->isOpHelper && !insertionInstr->AsLabelInstr()->isOpHelper)
            {
                // Ignore assertion error for cases where we insert an "airlock" helper block
                // for a Branch instruction's helper path that:
                //  1) ends up being empty
                //  2) comes after a helper block from another instruction
                //  3) is followed by a non-helper block
                //
                // Currently we would mark this block as a non-helper, but that makes
                // this block only reachable through helper blocks, thus failing the assert 
#if DBG
                if (insertionInstr->m_prev->AsLabelInstr()->isOpHelper)
                {
                    insertionInstr->m_prev->AsLabelInstr()->m_noHelperAssert = true;
                }
#endif
                insertionInstr->m_prev->AsLabelInstr()->isOpHelper = false;
            }
        }
    }
}